

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O3

void printDefines(FILE *out,TA_FuncInfo *funcInfo)

{
  TA_IntegerList *pTVar1;
  long *plVar2;
  TA_RetCode TVar3;
  char *pcVar4;
  char *pcVar5;
  uint paramIndex;
  ulong uVar6;
  TA_OptInputParameterInfo *optInputParamInfo;
  TA_OptInputParameterInfo *local_40;
  TA_IntegerList *local_38;
  
  if ((out != (FILE *)0x0) && (funcInfo->nbOptInput != 0)) {
    local_38 = &TA_MA_TypeList;
    paramIndex = 0;
    do {
      TVar3 = TA_GetOptInputParameterInfo(funcInfo->handle,paramIndex,&local_40);
      if (TVar3 != TA_SUCCESS) {
        printf("[%s] invalid \'optional input\' information\n",funcInfo->name);
        return;
      }
      pcVar4 = local_40->paramName;
      if (local_40->type == TA_OptInput_RealList) {
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "optInReal";
        }
        fprintf((FILE *)out,"\n/* TA_%s: Optional Parameter %s */\n",funcInfo->name,pcVar4);
        plVar2 = (long *)local_40->dataSet;
        if ((int)plVar2[1] != 0) {
          uVar6 = 0;
LAB_001173d1:
          pcVar5 = gTempBuf;
          strcpy(gTempBuf,*(char **)(*plVar2 + 8 + uVar6 * 0x10));
          pcVar4 = gTempBuf;
          do {
            if (*pcVar4 == ' ') {
              *pcVar4 = '_';
            }
            else if (*pcVar4 == '\0') goto LAB_00117402;
            pcVar4 = pcVar4 + 1;
          } while( true );
        }
LAB_0011744b:
        fputc(10,(FILE *)out);
      }
      else if ((local_40->type == TA_OptInput_IntegerList) &&
              (pTVar1 = (TA_IntegerList *)local_40->dataSet, pTVar1 != local_38)) {
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "optInInteger";
        }
        fprintf((FILE *)out,"\n/* TA_%s: Optional Parameter %s */\n",funcInfo->name,pcVar4);
        if (pTVar1->nbElement != 0) {
          uVar6 = 0;
LAB_00117328:
          pcVar5 = gTempBuf;
          strcpy(gTempBuf,pTVar1->data[uVar6].string);
          pcVar4 = gTempBuf;
          do {
            if (*pcVar4 == ' ') {
              *pcVar4 = '_';
            }
            else if (*pcVar4 == '\0') goto LAB_00117359;
            pcVar4 = pcVar4 + 1;
          } while( true );
        }
        goto LAB_0011744b;
      }
      paramIndex = paramIndex + 1;
    } while (paramIndex < funcInfo->nbOptInput);
  }
  return;
LAB_00117402:
  trimWhitespace(pcVar5);
  cnvtToUpperCase(pcVar5);
  pcVar4 = funcInfo->name;
  doubleToStr(*(double *)(*plVar2 + uVar6 * 0x10));
  fprintf((FILE *)out,"#define TA_%s_%s %s\n",pcVar4,gTempBuf,gTempDoubleToStr);
  uVar6 = uVar6 + 1;
  if (*(uint *)(plVar2 + 1) <= uVar6) goto LAB_0011744b;
  goto LAB_001173d1;
LAB_00117359:
  trimWhitespace(pcVar5);
  cnvtToUpperCase(pcVar5);
  fprintf((FILE *)out,"#define TA_%s_%s %d\n",funcInfo->name,gTempBuf,
          (ulong)(uint)pTVar1->data[uVar6].value);
  uVar6 = uVar6 + 1;
  if (pTVar1->nbElement <= uVar6) goto LAB_0011744b;
  goto LAB_00117328;
}

Assistant:

static void printDefines( FILE *out, const TA_FuncInfo *funcInfo )
{
   TA_RetCode retCode;
   const TA_OptInputParameterInfo *optInputParamInfo;
   unsigned int i, j;
   unsigned int paramNb;
   const char *paramName;
   const char *defaultParamName;
   TA_IntegerList *intList;
   TA_RealList    *realList;

   if (!out) return;

   /* Go through the optional parameter and print
    * the corresponding define for the TA_OptInput_IntegerList
    * and TA_OptInput_RealList having a string.
    */
   paramNb = 0;
   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      retCode = TA_GetOptInputParameterInfo( funcInfo->handle,
                                             i, &optInputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'optional input' information\n", funcInfo->name );
         return;
      }

      paramName = optInputParamInfo->paramName;

      /* TA_MA: Value for parameter */

      switch( optInputParamInfo->type )
      {
      case TA_OptInput_RealList:
         defaultParamName = "optInReal";
         break;
      case TA_OptInput_IntegerList:
         defaultParamName = "optInInteger";
         break;
      default:
         paramNb++;
         continue; /* Skip other type of parameter */
      }

      if( !paramName )
         paramName = defaultParamName;

      /* Output a comment to guide the user. */
         switch( optInputParamInfo->type )
         {
         case TA_OptInput_IntegerList:
            intList = (TA_IntegerList *)optInputParamInfo->dataSet;
            if( intList != (TA_IntegerList *)TA_DEF_UI_MA_Method.dataSet )
            {
               fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                        funcInfo->name, paramName );
               for( j=0; j < intList->nbElement; j++ )
               {
                  strcpy( gTempBuf, intList->data[j].string );
                  cnvtChar( gTempBuf, ' ', '_' );
                  trimWhitespace( gTempBuf );
                  cnvtToUpperCase( gTempBuf );
                  fprintf( out, "#define TA_%s_%s %d\n",
                           funcInfo->name,
                           gTempBuf,
                           intList->data[j].value );

               }
               fprintf( out, "\n" );
            }
            break;
         case TA_OptInput_RealList:
            fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                     funcInfo->name, paramName );

            realList = (TA_RealList *)optInputParamInfo->dataSet;
            for( j=0; j < realList->nbElement; j++ )
            {
               strcpy( gTempBuf, realList->data[j].string );
               cnvtChar( gTempBuf, ' ', '_' );
               trimWhitespace( gTempBuf );
               cnvtToUpperCase( gTempBuf );
               fprintf( out, "#define TA_%s_%s %s\n",
                        funcInfo->name,
                        gTempBuf,
                        doubleToStr(realList->data[j].value) );

            }
            fprintf( out, "\n" );
            break;
         default:
            /* Do nothing */
            break;
         }

      paramNb++;
   }
}